

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O3

MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_> *
deqp::egl::Image::createTextureImageSource
          (MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           *__return_storage_ptr__,EGLenum source,GLenum internalFormat,GLenum format,GLenum type,
          bool useTexLevel0)

{
  ImageSource *pIVar1;
  
  if (source == 0x30b1) {
    pIVar1 = (ImageSource *)operator_new(0x18);
    *(GLenum *)&pIVar1[1]._vptr_ImageSource = internalFormat;
    *(GLenum *)((long)&pIVar1[1]._vptr_ImageSource + 4) = format;
    *(GLenum *)&pIVar1[2]._vptr_ImageSource = type;
    *(bool *)((long)&pIVar1[2]._vptr_ImageSource + 4) = useTexLevel0;
    pIVar1->_vptr_ImageSource = (_func_int **)&PTR__ImageSource_02121370;
  }
  else {
    pIVar1 = (ImageSource *)operator_new(0x20);
    *(GLenum *)&pIVar1[1]._vptr_ImageSource = internalFormat;
    *(GLenum *)((long)&pIVar1[1]._vptr_ImageSource + 4) = format;
    *(GLenum *)&pIVar1[2]._vptr_ImageSource = type;
    *(bool *)((long)&pIVar1[2]._vptr_ImageSource + 4) = useTexLevel0;
    pIVar1->_vptr_ImageSource = (_func_int **)&PTR__ImageSource_021213e8;
    *(EGLenum *)&pIVar1[3]._vptr_ImageSource = source;
  }
  (__return_storage_ptr__->
  super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  ).m_data.ptr = pIVar1;
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ImageSource> createTextureImageSource (EGLenum source, GLenum internalFormat, GLenum format, GLenum type, bool useTexLevel0)
{
	if (source == EGL_GL_TEXTURE_2D_KHR)
		return MovePtr<ImageSource>(new Texture2DImageSource(internalFormat, format, type, useTexLevel0));
	else
		return MovePtr<ImageSource>(new TextureCubeMapImageSource(source, internalFormat, format, type, useTexLevel0));
}